

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void map_init_emacs(EditLine *el)

{
  el_action_t *peVar1;
  el_action_t *peVar2;
  el_action_t *peVar3;
  int iVar4;
  long lVar5;
  keymacro_value_t *val;
  wchar_t i;
  el_action_t *map;
  wchar_t buf [3];
  wchar_t local_2c [3];
  
  peVar1 = (el->el_map).alt;
  peVar2 = (el->el_map).key;
  peVar3 = (el->el_map).emacs;
  (el->el_map).type = L'\0';
  (el->el_map).current = peVar2;
  keymacro_reset(el);
  lVar5 = 0;
  do {
    peVar2[lVar5] = peVar3[lVar5];
    peVar1[lVar5] = '\x1c';
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  map_init_meta(el);
  peVar1 = (el->el_map).key;
  lVar5 = 0x80;
  do {
    iVar4 = iswprint((wint_t)lVar5);
    if (iVar4 != 0) {
      peVar1[lVar5] = '\t';
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x100);
  local_2c[0] = L'\x18';
  local_2c[1] = L'\x18';
  local_2c[2] = 0;
  val = keymacro_map_cmd(el,L'#');
  keymacro_add(el,local_2c,val,L'\0');
  tty_bind_char(el,L'\x01');
  terminal_bind_arrow(el);
  return;
}

Assistant:

libedit_private void
map_init_emacs(EditLine *el)
{
	int i;
	wchar_t buf[3];
	el_action_t *key = el->el_map.key;
	el_action_t *alt = el->el_map.alt;
	const el_action_t *emacs = el->el_map.emacs;

	el->el_map.type = MAP_EMACS;
	el->el_map.current = el->el_map.key;
	keymacro_reset(el);

	for (i = 0; i < N_KEYS; i++) {
		key[i] = emacs[i];
		alt[i] = ED_UNASSIGNED;
	}

	map_init_meta(el);
	map_init_nls(el);

	buf[0] = CONTROL('X');
	buf[1] = CONTROL('X');
	buf[2] = 0;
	keymacro_add(el, buf, keymacro_map_cmd(el, EM_EXCHANGE_MARK), XK_CMD);

	tty_bind_char(el, 1);
	terminal_bind_arrow(el);
}